

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintToFloatingPoint<float>(floating_point<float> *f,iu_ostream *os)

{
  ostream *poVar1;
  iu_stringstream ss;
  string sStack_1d8;
  string local_1b8 [32];
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [46];
  
  std::__cxx11::stringstream::stringstream(local_198);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 8;
  std::ostream::operator<<(&local_188,(f->m_v).fv);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(os,local_1b8);
  poVar1 = std::operator<<(poVar1,"(0x");
  ToHexString<unsigned_int>(&sStack_1d8,(f->m_v).uv);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1d8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}